

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O2

spvc_result
spvc_compiler_get_specialization_constants
          (spvc_compiler compiler,spvc_specialization_constant **constants,size_t *num_constants)

{
  spvc_specialization_constant sVar1;
  pointer *__ptr;
  long lVar2;
  spvc_specialization_constant local_118;
  spvc_specialization_constant **local_110;
  size_t *local_108;
  SmallVector<spirv_cross::SpecializationConstant,_8UL> spec_constants;
  SmallVector<spvc_specialization_constant,_8UL> translated;
  
  local_110 = constants;
  local_108 = num_constants;
  spirv_cross::Compiler::get_specialization_constants
            (&spec_constants,
             (compiler->compiler)._M_t.
             super___uniq_ptr_impl<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>
             ._M_t.
             super__Tuple_impl<0UL,_spirv_cross::Compiler_*,_std::default_delete<spirv_cross::Compiler>_>
             .super__Head_base<0UL,_spirv_cross::Compiler_*,_false>._M_head_impl);
  translated.super_VectorView<spvc_specialization_constant>.ptr =
       (spvc_specialization_constant *)&translated.stack_storage;
  translated.super_VectorView<spvc_specialization_constant>.buffer_size = 0;
  translated.buffer_capacity = 8;
  spirv_cross::SmallVector<spvc_specialization_constant,_8UL>::reserve
            (&translated,
             spec_constants.super_VectorView<spirv_cross::SpecializationConstant>.buffer_size);
  for (lVar2 = 0;
      spec_constants.super_VectorView<spirv_cross::SpecializationConstant>.buffer_size << 3 != lVar2
      ; lVar2 = lVar2 + 8) {
    local_118 = *(spvc_specialization_constant *)
                 ((long)&((spec_constants.super_VectorView<spirv_cross::SpecializationConstant>.ptr)
                         ->id).id + lVar2);
    spirv_cross::SmallVector<spvc_specialization_constant,_8UL>::push_back(&translated,&local_118);
  }
  sVar1 = (spvc_specialization_constant)operator_new(0x60);
  *(long *)((long)sVar1 + 0x50) = 0;
  *(long *)((long)sVar1 + 0x58) = 0;
  *(long *)((long)sVar1 + 0x40) = 0;
  *(long *)((long)sVar1 + 0x48) = 0;
  *(long *)((long)sVar1 + 0x30) = 0;
  *(long *)((long)sVar1 + 0x38) = 0;
  *(long *)((long)sVar1 + 0x20) = 0;
  *(long *)((long)sVar1 + 0x28) = 0;
  *(undefined ***)sVar1 = &PTR__TemporaryBuffer_0047ebc8;
  *(long *)((long)sVar1 + 0x10) = 0;
  *(long **)((long)sVar1 + 8) = (long *)((long)sVar1 + 0x20);
  *(long *)((long)sVar1 + 0x18) = 8;
  spirv_cross::SmallVector<spvc_specialization_constant,_8UL>::operator=
            ((SmallVector<spvc_specialization_constant,_8UL> *)((long)sVar1 + 8),&translated);
  *local_110 = *(spvc_specialization_constant **)((long)sVar1 + 8);
  *local_108 = *(size_t *)((long)sVar1 + 0x10);
  local_118 = sVar1;
  spirv_cross::
  SmallVector<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>,_8UL>
  ::push_back(&compiler->context->allocations,
              (unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_> *)
              &local_118);
  if (local_118 != (spvc_specialization_constant)0x0) {
    (**(code **)(*(long *)local_118 + 8))();
  }
  spirv_cross::SmallVector<spvc_specialization_constant,_8UL>::~SmallVector(&translated);
  spirv_cross::SmallVector<spirv_cross::SpecializationConstant,_8UL>::~SmallVector(&spec_constants);
  return SPVC_SUCCESS;
}

Assistant:

spvc_result spvc_compiler_get_specialization_constants(spvc_compiler compiler,
                                                       const spvc_specialization_constant **constants,
                                                       size_t *num_constants)
{
	SPVC_BEGIN_SAFE_SCOPE
	{
		auto spec_constants = compiler->compiler->get_specialization_constants();
		SmallVector<spvc_specialization_constant> translated;
		translated.reserve(spec_constants.size());
		for (auto &c : spec_constants)
		{
			spvc_specialization_constant trans = { c.id, c.constant_id };
			translated.push_back(trans);
		}

		auto ptr = spvc_allocate<TemporaryBuffer<spvc_specialization_constant>>();
		ptr->buffer = std::move(translated);
		*constants = ptr->buffer.data();
		*num_constants = ptr->buffer.size();
		compiler->context->allocations.push_back(std::move(ptr));
	}